

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::post_file_progress(torrent *this,file_progress_flags_t flags)

{
  alert_manager *this_00;
  undefined1 local_58 [48];
  vector<std::int64_t,_file_index_t> fp;
  torrent *this_local;
  file_progress_flags_t flags_local;
  
  fp.super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>
  ::container_wrapper((container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>
                       *)(local_58 + 0x28));
  local_58[0x27] = flags.m_val;
  file_progress(this,(container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>
                      *)(local_58 + 0x28),flags);
  this_00 = alerts(this);
  get_handle((torrent *)local_58);
  alert_manager::
  emplace_alert<libtorrent::file_progress_alert,libtorrent::torrent_handle,libtorrent::aux::container_wrapper<long,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<long,std::allocator<long>>>>
            (this_00,(torrent_handle *)local_58,
             (container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>
              *)(local_58 + 0x28));
  torrent_handle::~torrent_handle((torrent_handle *)local_58);
  container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>
  ::~container_wrapper
            ((container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>
              *)(local_58 + 0x28));
  return;
}

Assistant:

void torrent::post_file_progress(file_progress_flags_t const flags)
	{
		aux::vector<std::int64_t, file_index_t> fp;
		file_progress(fp, flags);
		alerts().emplace_alert<file_progress_alert>(get_handle(), std::move(fp));
	}